

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack18_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x40000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xe;
  *puVar1 = (in[2] - base) * 0x10 | *puVar1;
  *puVar1 = (in[3] - base) * 0x400000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 10;
  *puVar1 = (in[4] - base) * 0x100 | *puVar1;
  *puVar1 = (in[5] - base) * 0x4000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] - base >> 6;
  *puVar1 = (in[6] - base) * 0x1000 | *puVar1;
  *puVar1 = (in[7] - base) * 0x40000000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[7] - base >> 2;
  *puVar1 = (in[8] - base) * 0x10000 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[8] - base >> 0x10;
  *puVar1 = (in[9] - base) * 4 | *puVar1;
  *puVar1 = (in[10] - base) * 0x100000 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[10] - base >> 0xc;
  *puVar1 = (in[0xb] - base) * 0x40 | *puVar1;
  *puVar1 = (in[0xc] - base) * 0x1000000 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xc] - base >> 8;
  *puVar1 = (in[0xd] - base) * 0x400 | *puVar1;
  *puVar1 = (in[0xe] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xe] - base >> 4;
  *puVar1 = (in[0xf] - base) * 0x4000 | *puVar1;
  return out + 9;
}

Assistant:

uint32_t * pack18_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 18  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    ++in;

    return out;
}